

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O0

bool __thiscall
InputSource::findLast
          (InputSource *this,char *start_chars,qpdf_offset_t offset,size_t len,Finder *finder)

{
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long local_58;
  size_t local_50;
  size_t cur_len;
  qpdf_offset_t cur_offset;
  qpdf_offset_t after_found_offset;
  Finder *pFStack_30;
  bool found;
  Finder *finder_local;
  size_t len_local;
  qpdf_offset_t offset_local;
  char *start_chars_local;
  InputSource *this_local;
  
  after_found_offset._7_1_ = 0;
  cur_offset = 0;
  local_50 = len;
  cur_len = offset;
  pFStack_30 = finder;
  finder_local = (Finder *)len;
  len_local = offset;
  offset_local = (qpdf_offset_t)start_chars;
  start_chars_local = (char *)this;
  while( true ) {
    bVar2 = findFirst(this,(char *)offset_local,cur_len,local_50,pFStack_30);
    if (!bVar2) break;
    if ((after_found_offset._7_1_ & 1) == 0) {
      after_found_offset._7_1_ = 1;
    }
    else {
      QTC::TC("libtests","InputSource findLast found more than one",0);
    }
    iVar3 = (*this->_vptr_InputSource[4])();
    pFVar1 = finder_local;
    cur_len = CONCAT44(extraout_var,iVar3);
    local_58 = cur_len - len_local;
    cur_offset = cur_len;
    local_50 = QIntC::to_size<long_long>(&local_58);
    local_50 = (long)pFVar1 - local_50;
  }
  if ((after_found_offset._7_1_ & 1) != 0) {
    (*this->_vptr_InputSource[5])(this,cur_offset,0);
  }
  return (bool)(after_found_offset._7_1_ & 1);
}

Assistant:

bool
InputSource::findLast(char const* start_chars, qpdf_offset_t offset, size_t len, Finder& finder)
{
    bool found = false;
    qpdf_offset_t after_found_offset = 0;
    qpdf_offset_t cur_offset = offset;
    size_t cur_len = len;
    while (this->findFirst(start_chars, cur_offset, cur_len, finder)) {
        if (found) {
            QTC::TC("libtests", "InputSource findLast found more than one");
        } else {
            found = true;
        }
        after_found_offset = this->tell();
        cur_offset = after_found_offset;
        cur_len = len - QIntC::to_size((cur_offset - offset));
    }
    if (found) {
        this->seek(after_found_offset, SEEK_SET);
    }
    return found;
}